

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_echo.c
# Opt level: O2

cio_socket * alloc_echo_client(void)

{
  long lVar1;
  void *pvVar2;
  cio_socket *pcVar3;
  
  pvVar2 = malloc(0x260);
  if (pvVar2 == (void *)0x0) {
    pcVar3 = (cio_socket *)0x0;
  }
  else {
    lVar1 = (long)pvVar2 + 0x1e0;
    *(long *)((long)pvVar2 + 0x1c0) = lVar1;
    *(long *)((long)pvVar2 + 0x1c8) = (long)pvVar2 + 0x260;
    *(long *)((long)pvVar2 + 0x1d8) = lVar1;
    *(long *)((long)pvVar2 + 0x1d0) = lVar1;
    pcVar3 = (cio_socket *)((long)pvVar2 + 0xa8);
  }
  return pcVar3;
}

Assistant:

static struct cio_socket *alloc_echo_client(void)
{
	struct echo_client *client = malloc(sizeof(*client));
	if (cio_unlikely(client == NULL)) {
		return NULL;
	}

	cio_read_buffer_init(&client->rb, client->buffer, sizeof(client->buffer));

	return &client->socket;
}